

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CheckType(LlvmCompilationContext *ctx,ExprBase *node,LLVMValueRef value)

{
  ExpressionContext *pEVar1;
  LLVMTypeRef pLVar2;
  long lVar3;
  TypeBase *type;
  
  type = node->type;
  pEVar1 = ctx->ctx;
  if (value == (LLVMValueRef)0x0) {
    if (type == pEVar1->typeVoid) {
      return (LLVMValueRef)0x0;
    }
    __assert_fail("node->type == ctx.ctx.typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x27b,
                  "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
  }
  lVar3 = 0x89d8;
  if (((pEVar1->typeBool != type) && (pEVar1->typeChar != type)) && (pEVar1->typeShort != type)) {
    if (pEVar1->typeFloat != type) goto LAB_0026b12f;
    lVar3 = 0x89f0;
  }
  type = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
LAB_0026b12f:
  pLVar2 = CompileLlvmType(ctx,type);
  if (pLVar2 == (LLVMTypeRef)&placeholderType) {
    return value;
  }
  printf("Wrong result type\nExpected: ");
  printf("\n     Got: ");
  putchar(10);
  __assert_fail("!\"wrong result type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x28b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CheckType(LlvmCompilationContext &ctx, ExprBase *node, LLVMValueRef value)
{
	if(!value)
	{
		assert(node->type == ctx.ctx.typeVoid);

		return NULL;
	}

	LLVMTypeRef valueType = LLVMTypeOf(value);
	LLVMTypeRef expectedType = CompileLlvmType(ctx, GetStackType(ctx, node->type));

	if(valueType != expectedType)
	{
		printf("Wrong result type\nExpected: ");
		LLVMDumpType(expectedType);
		printf("\n     Got: ");
		LLVMDumpType(valueType);
		printf("\n");

		assert(!"wrong result type");
	}

	return value;
}